

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_2::DoesStructContainRTA(ValidationState_t *_,Instruction *inst)

{
  uint id;
  Op OVar1;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this;
  size_type sVar2;
  Instruction *this_00;
  Instruction *member_type;
  ulong uStack_28;
  uint member_id;
  size_t member_index;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  uStack_28 = 1;
  while( true ) {
    this = val::Instruction::operands((Instruction *)inst);
    sVar2 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this);
    if (sVar2 <= uStack_28) {
      return false;
    }
    id = val::Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,uStack_28);
    this_00 = ValidationState_t::FindDef(_,id);
    OVar1 = val::Instruction::opcode(this_00);
    if (OVar1 == OpTypeRuntimeArray) break;
    uStack_28 = uStack_28 + 1;
  }
  return true;
}

Assistant:

bool DoesStructContainRTA(const ValidationState_t& _, const Instruction* inst) {
  for (size_t member_index = 1; member_index < inst->operands().size();
       ++member_index) {
    const auto member_id = inst->GetOperandAs<uint32_t>(member_index);
    const auto member_type = _.FindDef(member_id);
    if (member_type->opcode() == spv::Op::OpTypeRuntimeArray) return true;
  }
  return false;
}